

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginChildFrame(ImGuiID id,ImVec2 *size,ImGuiWindowFlags extra_flags)

{
  ImVec4 *pIVar1;
  ImVec4 *pIVar2;
  ImGuiColorMod *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  long lVar9;
  
  pIVar7 = GImGui;
  PushStyleColor(3,(GImGui->Style).Colors + 7);
  PushStyleVar(6,(pIVar7->Style).FrameRounding);
  PushStyleVar(7,(pIVar7->Style).FrameBorderSize);
  PushStyleVar(1,&(pIVar7->Style).FramePadding);
  bVar8 = BeginChildEx((char *)0x0,id,size,true,extra_flags | 0x10004);
  PopStyleVar(3);
  pIVar7 = GImGui;
  pIVar3 = (GImGui->ColorStack).Data;
  lVar9 = (long)(GImGui->ColorStack).Size;
  pIVar1 = &pIVar3[lVar9 + -1].BackupValue;
  fVar4 = pIVar1->y;
  fVar5 = pIVar1->z;
  fVar6 = pIVar1->w;
  pIVar2 = (GImGui->Style).Colors + pIVar3[lVar9 + -1].Col;
  pIVar2->x = pIVar1->x;
  pIVar2->y = fVar4;
  pIVar2->z = fVar5;
  pIVar2->w = fVar6;
  (pIVar7->ColorStack).Size = (pIVar7->ColorStack).Size + -1;
  return bVar8;
}

Assistant:

bool ImGui::BeginChildFrame(ImGuiID id, const ImVec2& size, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    PushStyleColor(ImGuiCol_ChildBg, style.Colors[ImGuiCol_FrameBg]);
    PushStyleVar(ImGuiStyleVar_ChildRounding, style.FrameRounding);
    PushStyleVar(ImGuiStyleVar_ChildBorderSize, style.FrameBorderSize);
    PushStyleVar(ImGuiStyleVar_WindowPadding, style.FramePadding);
    bool ret = BeginChild(id, size, true, ImGuiWindowFlags_NoMove | ImGuiWindowFlags_AlwaysUseWindowPadding | extra_flags);
    PopStyleVar(3);
    PopStyleColor();
    return ret;
}